

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

s_level * get_first_elemental_plane(void)

{
  int iVar1;
  s_level **ppsVar2;
  s_level **ppsVar3;
  s_level *psVar4;
  
  ppsVar2 = &sp_levchn;
  do {
    ppsVar2 = &((s_level *)ppsVar2)->next->next;
    if ((s_level *)ppsVar2 == (s_level *)0x0) break;
    iVar1 = strncasecmp("dummy",((s_level *)ppsVar2)->proto,0xffffffffffffffff);
  } while (iVar1 != 0);
  ppsVar3 = &sp_levchn;
  do {
    ppsVar3 = &((s_level *)ppsVar3)->next->next;
    if ((s_level *)ppsVar3 == (s_level *)0x0) break;
    iVar1 = strncasecmp("astral",((s_level *)ppsVar3)->proto,0xffffffffffffffff);
  } while (iVar1 != 0);
  do {
    psVar4 = (s_level *)ppsVar3;
    if (psVar4 == (s_level *)0x0) {
      return (s_level *)0x0;
    }
    ppsVar3 = &psVar4->next->next;
  } while (psVar4->next != (s_level *)ppsVar2);
  return psVar4;
}

Assistant:

s_level *get_first_elemental_plane(void)
{
	s_level *curr,
		*dummy = find_level("dummy");
	for (curr = find_level("astral"); curr; curr = curr->next) {
	    if (curr->next == dummy)
		return curr;
	}
	return NULL;
}